

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall
correctness_shl_long_Test::~correctness_shl_long_Test(correctness_shl_long_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(correctness, shl_long)
{
    EXPECT_EQ(big_integer("1091951238831590836520041079875950759639875963123939936"),
              big_integer("34123476213487213641251283746123461238746123847623123") << 5);

    EXPECT_EQ(big_integer("-104637598388784443044449444577438556334703518260785595038524928"),
              big_integer("-817481237412378461284761285761238721364871236412387461238476") << 7);

    EXPECT_EQ(big_integer("26502603392713913241969902328696116541550413468869982914247384891392"),
              big_integer("12341236412857618761234871264871264128736412836643859238479") << 31);
}